

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O2

void __thiscall
QTextDocumentPrivate::setLayout(QTextDocumentPrivate *this,QAbstractTextDocumentLayout *layout)

{
  bool bVar1;
  QAbstractTextDocumentLayout *pQVar2;
  QTextDocument *this_00;
  int iVar3;
  BlockMap *__ptr;
  long in_FS_OFFSET;
  anon_union_8_2_e778645c_for_QFragmentMapData<QTextBlockData>_1 local_38;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = this->lout;
  if (pQVar2 != layout) {
    this_00 = *(QTextDocument **)&this->field_0x8;
    if (pQVar2 == (QAbstractTextDocumentLayout *)0x0) {
      this->lout = layout;
    }
    else {
      (**(code **)(*(long *)pQVar2 + 0x20))();
      this->lout = layout;
      __ptr = &this->blocks;
      local_38.head = (Header *)&DAT_aaaaaaaaaaaaaaaa;
      puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
      QFragmentMap<QTextBlockData>::begin((QFragmentMap<QTextBlockData> *)&local_38);
      while (((ulong)puStack_30 & 0xffffffff) != 0) {
        QTextBlockData::free
                  ((QTextBlockData *)
                   (((ulong)puStack_30 & 0xffffffff) * 0x48 + *(long *)local_38.head),__ptr);
        QFragmentMap<QTextBlockData>::Iterator::operator++((Iterator *)&local_38);
      }
    }
    QTextDocument::documentLayoutChanged(this_00);
    bVar1 = this->inContentsChange;
    this->inContentsChange = true;
    iVar3 = length(this);
    QTextDocument::contentsChange(this_00,0,0,iVar3);
    this->inContentsChange = bVar1;
    pQVar2 = this->lout;
    if (pQVar2 != (QAbstractTextDocumentLayout *)0x0) {
      iVar3 = length(this);
      (**(code **)(*(long *)pQVar2 + 0x90))(pQVar2,0,0,iVar3);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextDocumentPrivate::setLayout(QAbstractTextDocumentLayout *layout)
{
    Q_Q(QTextDocument);
    if (lout == layout)
        return;
    const bool firstLayout = !lout;
    delete lout;
    lout = layout;

    if (!firstLayout)
        for (BlockMap::Iterator it = blocks.begin(); !it.atEnd(); ++it)
            it->free();

    emit q->documentLayoutChanged();
    {
        QScopedValueRollback<bool> bg(inContentsChange, true);
        emit q->contentsChange(0, 0, length());
    }
    if (lout)
        lout->documentChanged(0, 0, length());
}